

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

void os_get_special_path(char *buf,size_t buflen,char *argv0,int id)

{
  int iVar1;
  undefined4 in_ECX;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  int statRet;
  stat inf;
  char *res;
  uint in_stack_ffffffffffffff60;
  __uid_t in_stack_ffffffffffffff64;
  size_t in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *local_28;
  
  switch(in_ECX) {
  case 1:
    local_28 = getenv("T3_RESDIR");
    if ((local_28 == (char *)0x0) || (*local_28 == '\0')) {
      local_28 = "/usr/local/share/frobtads/tads3/res";
    }
    break;
  case 2:
    local_28 = getenv("T3_INCDIR");
    if ((local_28 == (char *)0x0) || (*local_28 == '\0')) {
      local_28 = "/usr/local/share/frobtads/tads3/include";
    }
    break;
  case 3:
    local_28 = getenv("T3_LIBDIR");
    if ((local_28 == (char *)0x0) || (*local_28 == '\0')) {
      local_28 = "/usr/local/share/frobtads/tads3/lib";
    }
    break;
  case 4:
    local_28 = getenv("T3_USERLIBDIR");
    break;
  default:
    local_28 = (char *)0x0;
    break;
  case 6:
    local_28 = getenv("T3_CONFIG");
    if ((local_28 == (char *)0x0) && (in_RDX != 0)) {
      os_get_path_name(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      return;
    }
    break;
  case 7:
    local_28 = getenv("T3_LOGDIR");
    if ((local_28 == (char *)0x0) || (*local_28 == '\0')) {
      local_28 = "/tmp/frob.log";
    }
  }
  if (((local_28 == (char *)0x0) ||
      (iVar1 = stat(local_28,(stat *)&stack0xffffffffffffff48), iVar1 != 0)) ||
     ((in_stack_ffffffffffffff60 & 0xf000) != 0x4000)) {
    *in_RDI = '\0';
  }
  else {
    strncpy(in_RDI,local_28,in_RSI - 1);
  }
  return;
}

Assistant:

void
os_get_special_path( char* buf, size_t buflen, const char* argv0, int id )
{
    const char* res;

    switch (id) {
      case OS_GSP_T3_RES:
        res = getenv("T3_RESDIR");
        if (res == 0 or res[0] == '\0') {
            res = T3_RES_DIR;
        }
        break;

      case OS_GSP_T3_INC:
        res = getenv("T3_INCDIR");
        if (res == 0 or res[0] == '\0') {
            res = T3_INC_DIR;
        }
        break;

      case OS_GSP_T3_LIB:
        res = getenv("T3_LIBDIR");
        if (res == 0 or res[0] == '\0') {
            res = T3_LIB_DIR;
        }
        break;

      case OS_GSP_T3_USER_LIBS:
        // There's no compile-time default for user libs.
        res = getenv("T3_USERLIBDIR");
        break;

      case OS_GSP_T3_SYSCONFIG:
        res = getenv("T3_CONFIG");
        if (res == 0 and argv0 != 0) {
            os_get_path_name(buf, buflen, argv0);
            return;
        }
        break;

      case OS_GSP_LOGFILE:
        res = getenv("T3_LOGDIR");
        if (res == 0 or res[0] == '\0') {
            res = T3_LOG_FILE;
        }
        break;

      default:
        // TODO: We could print a warning here to inform the
        // user that we're outdated.
        res = 0;
    }

    if (res != 0) {
        // Only use the detected path if it exists and is a
        // directory.
        struct stat inf;
        int statRet = stat(res, &inf);
        if (statRet == 0 and (inf.st_mode & S_IFMT) == S_IFDIR) {
            strncpy(buf, res, buflen - 1);
            return;
        }
    }
    // Indicate failure.
    buf[0] = '\0';
}